

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void udata_checkCommonData_63(UDataMemory *udm,UErrorCode *err)

{
  uint8_t uVar1;
  DataHeader *pDVar2;
  commonDataFuncs *pcVar3;
  
  if (U_ZERO_ERROR < *err) {
    return;
  }
  if ((((udm == (UDataMemory *)0x0) || (pDVar2 = udm->pHeader, pDVar2 == (DataHeader *)0x0)) ||
      ((pDVar2->dataHeader).magic1 != 0xda)) ||
     ((((pDVar2->dataHeader).magic2 != '\'' || ((pDVar2->info).isBigEndian != '\0')) ||
      ((pDVar2->info).charsetFamily != '\0')))) {
LAB_0030ba0d:
    *err = U_INVALID_FORMAT_ERROR;
  }
  else {
    uVar1 = (pDVar2->info).dataFormat[0];
    if (uVar1 == 'T') {
      if (((((pDVar2->info).dataFormat[1] != 'o') || ((pDVar2->info).dataFormat[2] != 'C')) ||
          ((pDVar2->info).dataFormat[3] != 'P')) || ((pDVar2->info).formatVersion[0] != '\x01'))
      goto LAB_0030ba0d;
      pcVar3 = &ToCPFuncs;
    }
    else {
      if (((uVar1 != 'C') || ((pDVar2->info).dataFormat[1] != 'm')) ||
         (((pDVar2->info).dataFormat[2] != 'n' ||
          (((pDVar2->info).dataFormat[3] != 'D' || ((pDVar2->info).formatVersion[0] != '\x01'))))))
      goto LAB_0030ba0d;
      pcVar3 = &CmnDFuncs;
    }
    udm->vFuncs = pcVar3;
    udm->toc = (pDVar2->info).dataFormat + ((ulong)(pDVar2->dataHeader).headerSize - 0xc);
  }
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  if (udm != (UDataMemory *)0x0) {
    uprv_unmapFile_63(udm);
    if (udm->heapAllocated != '\0') {
      uprv_free_63(udm);
      return;
    }
    udm->mapAddr = (void *)0x0;
    udm->map = (void *)0x0;
    udm->toc = (void *)0x0;
    *(undefined8 *)&udm->heapAllocated = 0;
    udm->vFuncs = (commonDataFuncs *)0x0;
    udm->pHeader = (DataHeader *)0x0;
    *(undefined8 *)&udm->length = 0;
    udm->length = -1;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }